

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O0

void __thiscall DObject::~DObject(DObject *this)

{
  bool bVar1;
  PClass *this_00;
  char *local_40;
  long *local_20;
  DObject **probe;
  PClass *type;
  DObject *this_local;
  
  this->_vptr_DObject = (_func_int **)&PTR_StaticType_009f2a70;
  if ((PClass::bShutdown & 1U) == 0) {
    this_00 = GetClass(this);
    if (((this->ObjectFlags & 0x40) == 0) && ((PClass::bShutdown & 1U) == 0)) {
      if ((this->ObjectFlags & 0x80) == 0) {
        if (this_00 == (PClass *)0x0) {
          local_40 = "==some object==";
        }
        else {
          local_40 = FName::GetChars(&(this_00->super_PNativeStruct).super_PStruct.super_PNamedType.
                                      TypeName);
        }
        Printf("Warning: \'%s\' is freed outside the GC process.\n",local_40);
      }
      StaticPointerSubstitution(this,(DObject *)0x0,false);
      for (local_20 = &GC::Root; *local_20 != 0; local_20 = (long *)(*local_20 + 0x10)) {
        if ((DObject *)*local_20 == this) {
          *local_20 = (long)this->ObjNext;
          if (&this->ObjNext == (DObject **)GC::SweepPos) {
            GC::SweepPos = local_20;
          }
          break;
        }
      }
      bVar1 = IsGray(this);
      if (bVar1) {
        for (local_20 = &GC::Gray; *local_20 != 0; local_20 = (long *)(*local_20 + 0x18)) {
          if ((DObject *)*local_20 == this) {
            *local_20 = (long)this->GCNext;
            break;
          }
        }
      }
    }
    if (this_00 != (PClass *)0x0) {
      PClass::DestroySpecials(this_00,this);
    }
  }
  return;
}

Assistant:

DObject::~DObject ()
{
	if (!PClass::bShutdown)
	{
		PClass *type = GetClass();
		if (!(ObjectFlags & OF_Cleanup) && !PClass::bShutdown)
		{
			DObject **probe;

			if (!(ObjectFlags & OF_YesReallyDelete))
			{
				Printf("Warning: '%s' is freed outside the GC process.\n",
					type != NULL ? type->TypeName.GetChars() : "==some object==");
			}

			// Find all pointers that reference this object and NULL them.
			StaticPointerSubstitution(this, NULL);

			// Now unlink this object from the GC list.
			for (probe = &GC::Root; *probe != NULL; probe = &((*probe)->ObjNext))
			{
				if (*probe == this)
				{
					*probe = ObjNext;
					if (&ObjNext == GC::SweepPos)
					{
						GC::SweepPos = probe;
					}
					break;
				}
			}

			// If it's gray, also unlink it from the gray list.
			if (this->IsGray())
			{
				for (probe = &GC::Gray; *probe != NULL; probe = &((*probe)->GCNext))
				{
					if (*probe == this)
					{
						*probe = GCNext;
						break;
					}
				}
			}
		}
		
		if (nullptr != type)
		{
			type->DestroySpecials(this);
		}
	}
}